

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

bool __thiscall
HighsMipSolverData::trySolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution,
          int solution_source)

{
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  HighsLp *pHVar4;
  pointer piVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  HighsInt j;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pdVar3 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar3) >> 3;
  pHVar4 = this->mipsolver->model_;
  if (pHVar4->num_col_ == (int)uVar7) {
    dVar2 = this->feastol;
    dVar11 = 0.0;
    dVar12 = 0.0;
    for (uVar8 = 0; (uVar7 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
      dVar13 = pdVar3[uVar8];
      if (dVar13 < (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8] - dVar2) {
        return false;
      }
      if ((pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] + dVar2 < dVar13) {
        return false;
      }
      if (((pHVar4->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar8] == kInteger) &&
         (dVar10 = round(dVar13), dVar2 < ABS(dVar13 - dVar10))) {
        return false;
      }
      dVar13 = dVar13 * (pHVar4->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar8];
      dVar10 = dVar12 + dVar13;
      dVar11 = dVar11 + (dVar12 - (dVar10 - dVar13)) + (dVar13 - (dVar10 - (dVar10 - dVar13)));
      dVar12 = dVar10;
    }
    piVar5 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      if (uVar7 == (uint)pHVar4->num_row_) {
        bVar6 = addIncumbent(this,solution,dVar11 + dVar12,solution_source,true,false);
        return bVar6;
      }
      dVar13 = 0.0;
      for (lVar9 = (long)piVar5[uVar7]; piVar5[uVar7 + 1] != lVar9; lVar9 = lVar9 + 1) {
        dVar13 = dVar13 + pdVar3[(this->ARindex_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar9]] *
                          (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar9];
      }
    } while ((dVar13 <= (pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar7] + dVar2) &&
            (pdVar1 = (pHVar4->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar7, uVar7 = uVar7 + 1,
            *pdVar1 - dVar2 <= dVar13));
  }
  return false;
}

Assistant:

bool HighsMipSolverData::trySolution(const std::vector<double>& solution,
                                     const int solution_source) {
  if (int(solution.size()) != mipsolver.model_->num_col_) return false;

  HighsCDouble obj = 0;

  for (HighsInt i = 0; i != mipsolver.model_->num_col_; ++i) {
    if (solution[i] < mipsolver.model_->col_lower_[i] - feastol) return false;
    if (solution[i] > mipsolver.model_->col_upper_[i] + feastol) return false;
    if (mipsolver.variableType(i) == HighsVarType::kInteger &&
        fractionality(solution[i]) > feastol)
      return false;

    obj += mipsolver.colCost(i) * solution[i];
  }

  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double rowactivity = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      rowactivity += solution[ARindex_[j]] * ARvalue_[j];

    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }

  return addIncumbent(solution, double(obj), solution_source);
}